

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# HydroProp.cpp
# Opt level: O0

void __thiscall OpenMD::HydroProp::HydroProp(HydroProp *this)

{
  string *in_RDI;
  string *this_00;
  
  std::__cxx11::string::string(in_RDI);
  Vector3<double>::Vector3((Vector3<double> *)0x3e365e);
  this_00 = in_RDI + 0x38;
  SquareMatrix<double,_6>::SquareMatrix((SquareMatrix<double,_6> *)this_00);
  SquareMatrix<double,_6>::SquareMatrix((SquareMatrix<double,_6> *)this_00);
  in_RDI[0x278] = (string)0x0;
  in_RDI[0x279] = (string)0x0;
  in_RDI[0x27a] = (string)0x0;
  return;
}

Assistant:

HydroProp::HydroProp() : hasCOR_(false), hasXi_(false), hasS_(false) {}